

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::dotRS(Forth *this)

{
  Cell CVar1;
  uint uVar2;
  ostream *poVar3;
  ulong index;
  
  index = (ulong)(this->rStack).top;
  CVar1 = getNumericBase(this);
  poVar3 = std::operator<<(&this->field_0x20,CVar1);
  poVar3 = std::operator<<(poVar3,"<<");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,">> ");
  while (index = index - 1, index != 0xffffffffffffffff) {
    if (this->writeToTarget == ToString) {
      uVar2 = ForthStack<unsigned_int>::getTop(&this->rStack,index);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&this->field_0x20,uVar2);
      std::operator<<(poVar3," ");
    }
    else if (this->writeToTarget == ToStdCout) {
      uVar2 = ForthStack<unsigned_int>::getTop(&this->rStack,index);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
      std::operator<<(poVar3," ");
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void dotRS() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			auto depth = rStack.stackDepth();
			std_cout << SETBASE() << "<<" << depth << ">> ";
			for (auto i = depth; i > 0; --i) {
				switch (writeToTarget) {
				case ToString:
					std_cout << static_cast<SCell>(rStack.getTop(i - 1)) << " ";
					break;
				case ToStdCout:
					std::cout << static_cast<SCell>(rStack.getTop(i - 1)) << " ";
					std::cout.flush();
					break;
				default:
					break;
				}
			}
#endif
		}